

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_ReduceOne_Test::~MxxReduce_ReduceOne_Test(MxxReduce_ReduceOne_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxReduce, ReduceOne) {
    mxx::comm c = mxx::comm();

    // test min
    int x = -13*(c.size() - c.rank());
    int y = mxx::reduce(x, c.size()/2, mxx::min<int>(), c);
    if (c.rank() == c.size()/2) {
        ASSERT_EQ(-13*c.size(), y);
    } else {
        ASSERT_EQ(0, y);
    }
    // test sum
    int z = mxx::reduce(3, 0, std::plus<int>(), c);
    if (c.rank() == 0) {
        ASSERT_EQ(3*c.size(), z);
    } else {
        ASSERT_EQ(0, z);
    }
    // test lambda op
    int g = mxx::reduce(2, c.size()-1, [](int i, int j){return i+j;});
    if (c.rank() == c.size()-1) {
        ASSERT_EQ(2*c.size(), g);
    } else {
        ASSERT_EQ(0, g);
    }
    // test functor
    float m = mxx::reduce(1.3333f*c.rank(), 0, mymax<float>(), c);
    if (c.rank() == 0) {
        ASSERT_EQ(1.3333f*(c.size()-1), m);
    } else {
        ASSERT_EQ(0, m);
    }
    // test own function pointer
    int v = c.rank() + 1;
    int u = mxx::reduce(v, 0, mymin, c);
    if (c.rank() == 0) {
        ASSERT_EQ(1, u);
    } else {
        ASSERT_EQ(0, u);
    }
}